

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comb_filter.hpp
# Opt level: O3

void re::math::comb_filter<float,1024l,512l>(span<const_float,_1024L> in,span<float,_512L> out)

{
  int i;
  long lVar1;
  pointer extraout_RDX;
  pointer peVar2;
  pointer extraout_RDX_00;
  extent_type<_1L> eVar3;
  float fVar4;
  span<const_float,__1L> input;
  
  memset((void *)out.storage_.data_,0,0x800);
  lVar1 = 1;
  do {
    *(float *)((long)out.storage_.data_ + lVar1 * 4) =
         *(float *)((long)in.storage_.data_ + lVar1 * 4) + 0.0 +
         *(float *)((long)out.storage_.data_ + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x200);
  eVar3.size_ = (long)in.storage_.data_ + 4;
  lVar1 = 1;
  peVar2 = extraout_RDX;
  do {
    input.storage_.data_ = peVar2;
    input.storage_.super_extent_type<_1L>.size_ = eVar3.size_;
    fVar4 = mean<float,_1l>((math *)0x3,input);
    *(float *)((long)out.storage_.data_ + lVar1 * 4) =
         fVar4 + *(float *)((long)out.storage_.data_ + lVar1 * 4);
    lVar1 = lVar1 + 1;
    eVar3.size_ = eVar3.size_ + 8;
    peVar2 = extraout_RDX_00;
  } while (lVar1 != 0x200);
  return;
}

Assistant:

void
comb_filter(gsl::span<T const, N_in> in, gsl::span<T, N_out> out)
noexcept {
    static_assert(N_in >= 0 && N_out >= 0);
    static_assert(N_in % N_out == 0);

    constexpr auto n_new =  (N_in > N_out) ? N_in - N_out : 0;
    constexpr auto stage = N_in / N_out;

    if (stage > 1) {
        comb_filter(gsl::span<T const, n_new>(in.data(), n_new), out);
    } else {
        std::fill(std::begin(out), std::end(out), 0);
    }

    for (auto i = 1; i < N_out; ++i) {
        out[i] += mean(in.subspan(stage * (i - 1) + 1, 2*stage - 1));
    }
}